

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

int Hop_ObjFanoutCount(Hop_Obj_t *pObj,Hop_Obj_t *pPivot)

{
  int iVar1;
  
  if (((ulong)pPivot & 1) == 0) {
    iVar1 = Hop_ObjFanoutCount_rec((Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe),pPivot);
    Hop_ConeUnmark_rec((Hop_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
    return iVar1;
  }
  __assert_fail("!Hop_IsComplement(pPivot)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/hop/hopDfs.c"
                ,0x139,"int Hop_ObjFanoutCount(Hop_Obj_t *, Hop_Obj_t *)");
}

Assistant:

int Hop_ObjFanoutCount( Hop_Obj_t * pObj, Hop_Obj_t * pPivot )
{
    int Counter;
    assert( !Hop_IsComplement(pPivot) );
    Counter = Hop_ObjFanoutCount_rec( Hop_Regular(pObj), pPivot );
    Hop_ConeUnmark_rec( Hop_Regular(pObj) );
    return Counter;
}